

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_STDDEV.c
# Opt level: O3

void TA_INT_stddev_using_precalc_ma
               (double *inReal,double *inMovAvg,int inMovAvgBegIdx,int inMovAvgNbElement,
               int timePeriod,double *output)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double __x;
  double dVar5;
  double dVar6;
  
  iVar3 = (inMovAvgBegIdx - timePeriod) + 1;
  dVar6 = 0.0;
  if (iVar3 < inMovAvgBegIdx) {
    lVar4 = 0;
    do {
      dVar6 = dVar6 + inReal[iVar3 + lVar4] * inReal[iVar3 + lVar4];
      lVar4 = lVar4 + 1;
    } while (timePeriod + -1 != (int)lVar4);
  }
  if (0 < inMovAvgNbElement) {
    uVar2 = 0;
    do {
      dVar6 = inReal[(long)inMovAvgBegIdx + uVar2] * inReal[(long)inMovAvgBegIdx + uVar2] + dVar6;
      dVar1 = inReal[(long)iVar3 + uVar2];
      __x = dVar6 / (double)timePeriod - inMovAvg[uVar2] * inMovAvg[uVar2];
      dVar5 = 0.0;
      if (1e-14 <= __x) {
        if (__x < 0.0) {
          dVar5 = sqrt(__x);
        }
        else {
          dVar5 = SQRT(__x);
        }
      }
      dVar6 = dVar6 - dVar1 * dVar1;
      output[uVar2] = dVar5;
      uVar2 = uVar2 + 1;
    } while ((uint)inMovAvgNbElement != uVar2);
  }
  return;
}

Assistant:

void TA_PREFIX(INT_stddev_using_precalc_ma)( const INPUT_TYPE *inReal,
                                             const double *inMovAvg,
                                             int inMovAvgBegIdx,
                                             int inMovAvgNbElement,
                                             int timePeriod,
                                             double *output )
#endif
{
   double tempReal, periodTotal2, meanValue2;
   int outIdx;

   /* Start/end index for sumation. */
   int startSum, endSum;

   startSum = 1+inMovAvgBegIdx-timePeriod;
   endSum = inMovAvgBegIdx;

   periodTotal2 = 0;

   for( outIdx = startSum; outIdx < endSum; outIdx++)
   {
      tempReal = inReal[outIdx];
      tempReal *= tempReal;
      periodTotal2 += tempReal;
   }

   for( outIdx=0; outIdx < inMovAvgNbElement; outIdx++, startSum++, endSum++ )
   {
      tempReal = inReal[endSum];
      tempReal *= tempReal;
      periodTotal2 += tempReal;
      meanValue2 = periodTotal2/timePeriod;

      tempReal = inReal[startSum];
      tempReal *= tempReal;
      periodTotal2 -= tempReal;

      tempReal = inMovAvg[outIdx];
      tempReal *= tempReal;
      meanValue2 -= tempReal;

      if( !TA_IS_ZERO_OR_NEG(meanValue2) )
         output[outIdx] = std_sqrt(meanValue2);
      else
         output[outIdx] = (double)0.0;
   }
}